

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O1

bool __thiscall units::measurement::operator<=(measurement *this,measurement *other)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  
  dVar5 = value_as(other,&this->units_);
  bVar1 = true;
  if (dVar5 < this->value_) {
    fVar6 = (float)this->value_;
    fVar7 = (float)dVar5;
    fVar4 = fVar6 - fVar7;
    if (((fVar4 != 0.0) || (NAN(fVar4))) && ((NAN(fVar4) || (0x7ffffe < (int)ABS(fVar4) - 1U)))) {
      fVar4 = (float)((int)fVar6 + 8U & 0xfffffff0);
      fVar2 = (float)((int)fVar7 + 8U & 0xfffffff0);
      if ((fVar4 != fVar2) || (NAN(fVar4) || NAN(fVar2))) {
        fVar3 = (float)((int)(fVar7 * 1.0000005) + 8U & 0xfffffff0);
        if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
          fVar7 = (float)((int)(fVar7 * 0.9999995) + 8U & 0xfffffff0);
          if ((fVar7 != fVar4) || (NAN(fVar7) || NAN(fVar4))) {
            fVar4 = (float)((int)(fVar6 * 1.0000005) + 8U & 0xfffffff0);
            if ((fVar4 != fVar2) || (NAN(fVar4) || NAN(fVar2))) {
              bVar1 = (bool)(-((float)((int)(fVar6 * 0.9999995) + 8U & 0xfffffff0) == fVar2) & 1);
            }
          }
        }
      }
    }
  }
  return bVar1;
}

Assistant:

bool operator<=(const measurement& other) const
    {
        auto val = other.value_as(units_);
        return (value_ <= val) ?
            true :
            detail::compare_round_equals(
                static_cast<float>(value_), static_cast<float>(val));
    }